

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.cpp
# Opt level: O0

void __thiscall
duckdb::WindowExecutorGlobalState::WindowExecutorGlobalState
          (WindowExecutorGlobalState *this,WindowExecutor *executor,idx_t payload_count,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  bool bVar1;
  _func_int **in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  element_type *in_RSI;
  LogicalType *in_RDI;
  element_type *in_R8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_38;
  long local_30;
  element_type *local_28;
  WindowExecutorState local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  element_type *local_10;
  
  local_28 = in_R8;
  local_20._vptr_WindowExecutorState = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  WindowExecutorState::WindowExecutorState((WindowExecutorState *)in_RDI);
  *(undefined ***)in_RDI = &PTR__WindowExecutorGlobalState_035358f0;
  (in_RDI->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10;
  (in_RDI->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_18
  ;
  *(_func_int ***)(in_RDI + 1) = local_20._vptr_WindowExecutorState;
  in_RDI[1].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  this_00 = &in_RDI[1].type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x1a2f481);
  local_30 = *(long *)&local_10->type + 0x68;
  local_38._M_current =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)in_stack_ffffffffffffff88);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator*(&local_38);
    in_stack_ffffffffffffff88 =
         &in_RDI[1].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    in_stack_ffffffffffffff90 =
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_ffffffffffffff90);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType&>
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

WindowExecutorGlobalState::WindowExecutorGlobalState(const WindowExecutor &executor, const idx_t payload_count,
                                                     const ValidityMask &partition_mask, const ValidityMask &order_mask)
    : executor(executor), payload_count(payload_count), partition_mask(partition_mask), order_mask(order_mask) {
	for (const auto &child : executor.wexpr.children) {
		arg_types.emplace_back(child->return_type);
	}
}